

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_gcd(mbedtls_mpi *G,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi *X;
  int iVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  ulong count;
  ulong uVar5;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi TG;
  mbedtls_mpi local_98;
  mbedtls_mpi local_80;
  mbedtls_mpi_uint local_68;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_80.s = 1;
  local_80.n = 0;
  local_80.p = (mbedtls_mpi_uint *)0x0;
  local_98.s = 1;
  local_98.n = 0;
  local_98.p = (mbedtls_mpi_uint *)0x0;
  iVar1 = mbedtls_mpi_copy(&local_80,A);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&local_98,B), iVar1 == 0)) {
    if (local_80.n == 0) {
      count = 0;
    }
    else {
      count = 0;
      lVar2 = 0;
      sVar3 = 0;
      do {
        uVar4 = 0;
        do {
          if ((local_80.p[sVar3] >> (uVar4 & 0x3f) & 1) != 0) {
            count = uVar4 - lVar2;
            goto LAB_00176098;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x40);
        sVar3 = sVar3 + 1;
        lVar2 = lVar2 + -0x40;
      } while (sVar3 != local_80.n);
    }
LAB_00176098:
    if (local_98.n == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      lVar2 = 0;
      sVar3 = 0;
      do {
        uVar5 = 0;
        do {
          if ((local_98.p[sVar3] >> (uVar5 & 0x3f) & 1) != 0) {
            uVar4 = uVar5 - lVar2;
            goto LAB_001760db;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x40);
        sVar3 = sVar3 + 1;
        lVar2 = lVar2 + -0x40;
      } while (sVar3 != local_98.n);
    }
LAB_001760db:
    if (uVar4 < count) {
      count = uVar4;
    }
    iVar1 = mbedtls_mpi_shift_r(&local_80,count);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&local_98,count), iVar1 == 0)) {
      local_98.s = 1;
      local_80.s = 1;
      local_68 = 0;
      local_60.s = 1;
      local_60.n = 1;
      local_60.p = &local_68;
      iVar1 = mbedtls_mpi_cmp_mpi(&local_80,&local_60);
      if (iVar1 != 0) {
        do {
          if (local_80.n != 0) {
            lVar2 = 0;
            sVar3 = 0;
            do {
              uVar4 = 0;
              do {
                if ((local_80.p[sVar3] >> (uVar4 & 0x3f) & 1) != 0) {
                  sVar3 = uVar4 - lVar2;
                  goto LAB_001761b0;
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 != 0x40);
              sVar3 = sVar3 + 1;
              lVar2 = lVar2 + -0x40;
            } while (sVar3 != local_80.n);
          }
          sVar3 = 0;
LAB_001761b0:
          iVar1 = mbedtls_mpi_shift_r(&local_80,sVar3);
          if (iVar1 != 0) goto LAB_00176102;
          if (local_98.n != 0) {
            lVar2 = 0;
            sVar3 = 0;
            do {
              uVar4 = 0;
              do {
                if ((local_98.p[sVar3] >> (uVar4 & 0x3f) & 1) != 0) {
                  sVar3 = uVar4 - lVar2;
                  goto LAB_001761fb;
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 != 0x40);
              sVar3 = sVar3 + 1;
              lVar2 = lVar2 + -0x40;
            } while (sVar3 != local_98.n);
          }
          sVar3 = 0;
LAB_001761fb:
          iVar1 = mbedtls_mpi_shift_r(&local_98,sVar3);
          if (iVar1 != 0) goto LAB_00176102;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_80,&local_98);
          if (iVar1 < 0) {
            iVar1 = mbedtls_mpi_sub_abs(&local_98,&local_98,&local_80);
            X = &local_98;
          }
          else {
            iVar1 = mbedtls_mpi_sub_abs(&local_80,&local_80,&local_98);
            X = &local_80;
          }
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_shift_r(X,1), iVar1 != 0)) goto LAB_00176102;
          local_68 = 0;
          local_60.s = 1;
          local_60.n = 1;
          local_60.p = &local_68;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_80,&local_60);
        } while (iVar1 != 0);
      }
      iVar1 = mbedtls_mpi_shift_l(&local_98,count);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_copy(G,&local_98);
      }
    }
  }
LAB_00176102:
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_80);
  mbedtls_mpi_free(&local_98);
  return iVar1;
}

Assistant:

int mbedtls_mpi_gcd( mbedtls_mpi *G, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t lz, lzt;
    mbedtls_mpi TG, TA, TB;

    mbedtls_mpi_init( &TG ); mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );

    lz = mbedtls_mpi_lsb( &TA );
    lzt = mbedtls_mpi_lsb( &TB );

    if( lzt < lz )
        lz = lzt;

    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, lz ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, lz ) );

    TA.s = TB.s = 1;

    while( mbedtls_mpi_cmp_int( &TA, 0 ) != 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, mbedtls_mpi_lsb( &TA ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, mbedtls_mpi_lsb( &TB ) ) );

        if( mbedtls_mpi_cmp_mpi( &TA, &TB ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( &TA, &TA, &TB ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, 1 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( &TB, &TB, &TA ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, 1 ) );
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &TB, lz ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( G, &TB ) );

cleanup:

    mbedtls_mpi_free( &TG ); mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TB );

    return( ret );
}